

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O0

void glmc_rotate(vec4 *m,float angle,float *axis)

{
  undefined8 uVar1;
  float *in_RSI;
  undefined8 *in_RDI;
  float in_XMM0_Da;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  __m128 afVar2;
  __m128 a;
  __m128 a_00;
  __m128 a_01;
  __m128 a_02;
  __m128 a_03;
  __m128 b;
  __m128 b_00;
  __m128 b_01;
  __m128 b_02;
  __m128 b_03;
  __m128 b_04;
  __m128 c_00;
  __m128 c_01;
  __m128 c_02;
  __m128 c_03;
  __m128 c_04;
  __m128 c_05;
  mat4 rot;
  float c;
  vec3 vs;
  vec3 v;
  vec3 axisn;
  float norm;
  __m128 v2;
  __m128 v1;
  __m128 v0;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 l;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 *local_408;
  float local_3fc;
  float local_3f8;
  float local_3f4;
  float local_3f0;
  float local_3e8;
  float local_3e4;
  float local_3e0;
  float local_3d8;
  float local_3d4;
  float local_3d0;
  float *local_3c8;
  float local_3bc;
  float *local_3b8;
  undefined8 *local_3b0;
  undefined8 *local_3a8;
  undefined8 *local_3a0;
  float local_394;
  float *local_390;
  float *local_388;
  float *local_380;
  float local_374;
  float *local_370;
  float *local_368;
  float local_35c;
  float *local_358;
  float *local_350;
  float local_344;
  float *local_340;
  float *local_338;
  float local_32c;
  float *local_328;
  float *local_320;
  float local_314;
  float *local_310;
  float *local_308;
  float local_2fc;
  float *local_2f8;
  float *local_2f0;
  float *local_2e8;
  float *local_2e0;
  float *local_2d8;
  float *local_2d0;
  undefined8 local_2c8;
  float fStack_2c0;
  float fStack_2bc;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 uStack_44;
  float local_38;
  float local_28;
  float local_18;
  
  local_3b8 = (float *)&local_458;
  local_408 = in_RDI;
  local_3c8 = in_RSI;
  local_3bc = in_XMM0_Da;
  local_3fc = cosf(in_XMM0_Da);
  local_388 = local_3c8;
  local_390 = &local_3d8;
  local_2f0 = local_3c8;
  local_2e0 = local_3c8;
  local_2d0 = local_3c8;
  local_2d8 = local_3c8;
  local_394 = sqrtf(local_3c8[2] * local_3c8[2] +
                    *local_3c8 * *local_3c8 + local_3c8[1] * local_3c8[1]);
  if (local_394 < 1.1920929e-07) {
    local_2e8 = local_390;
    local_390[2] = 0.0;
    local_2e8[1] = 0.0;
    *local_2e8 = 0.0;
  }
  else {
    local_374 = 1.0 / local_394;
    local_370 = local_388;
    local_380 = local_390;
    *local_390 = *local_388 * local_374;
    local_380[1] = local_370[1] * local_374;
    local_380[2] = local_370[2] * local_374;
  }
  local_2fc = 1.0 - local_3fc;
  local_308 = &local_3e8;
  local_3e8 = local_3d8 * local_2fc;
  local_3e4 = local_3d4 * local_2fc;
  local_3e0 = local_3d0 * local_2fc;
  local_2f8 = &local_3d8;
  local_314 = sinf(local_3bc);
  local_320 = &local_3f8;
  local_3f8 = local_3d8 * local_314;
  local_3f4 = local_3d4 * local_314;
  local_3f0 = local_3d0 * local_314;
  local_32c = local_3e8;
  local_338 = local_3b8;
  local_328 = &local_3d8;
  local_310 = &local_3d8;
  *local_3b8 = local_3d8 * local_3e8;
  local_338[1] = local_328[1] * local_32c;
  local_338[2] = local_328[2] * local_32c;
  local_350 = local_3b8 + 4;
  local_344 = local_3e4;
  local_340 = &local_3d8;
  *local_350 = local_3d8 * local_3e4;
  local_350[1] = local_340[1] * local_344;
  local_350[2] = local_340[2] * local_344;
  local_368 = local_3b8 + 8;
  local_35c = local_3e0;
  local_358 = &local_3d8;
  *local_368 = local_3d8 * local_3e0;
  local_368[1] = local_358[1] * local_35c;
  local_368[2] = local_358[2] * local_35c;
  *local_3b8 = *local_3b8 + local_3fc;
  local_3b8[4] = local_3b8[4] - local_3f0;
  local_3b8[8] = local_3b8[8] + local_3f4;
  local_3b8[1] = local_3b8[1] + local_3f0;
  local_3b8[5] = local_3b8[5] + local_3fc;
  local_3b8[9] = local_3b8[9] - local_3f8;
  local_3b8[2] = local_3b8[2] - local_3f4;
  local_3b8[6] = local_3b8[6] + local_3f8;
  local_3b8[10] = local_3b8[10] + local_3fc;
  local_3b8[0xe] = 0.0;
  local_3b8[0xd] = 0.0;
  local_3b8[0xc] = 0.0;
  local_3b8[0xb] = 0.0;
  local_3b8[7] = 0.0;
  local_3b8[3] = 0.0;
  local_3b8[0xf] = 1.0;
  local_3a0 = local_408;
  local_3a8 = &local_458;
  local_3b0 = local_408;
  local_240 = local_408;
  local_250 = local_408;
  local_190 = local_408;
  local_188 = *local_408;
  uStack_180 = local_408[1];
  local_278 = local_458;
  uStack_270 = uStack_450;
  local_1a0 = &local_448;
  local_288 = local_448;
  uStack_280 = uStack_440;
  local_1a8 = &local_438;
  local_298 = local_438;
  uStack_290 = uStack_430;
  local_18 = (float)local_458;
  local_a8 = local_18;
  fStack_a4 = local_18;
  fStack_a0 = local_18;
  fStack_9c = local_18;
  local_138 = CONCAT44(local_18,local_18);
  uStack_130 = CONCAT44(local_18,local_18);
  local_148._0_4_ = (float)local_188;
  local_148._4_4_ = (float)((ulong)local_188 >> 0x20);
  uStack_140._0_4_ = (float)uStack_180;
  uStack_140._4_4_ = (float)((ulong)uStack_180 >> 0x20);
  local_2a8 = CONCAT44(local_18 * local_148._4_4_,local_18 * (float)local_148);
  uStack_2a0 = CONCAT44(local_18 * uStack_140._4_4_,local_18 * (float)uStack_140);
  local_28 = (float)local_448;
  local_b8 = local_28;
  fStack_b4 = local_28;
  fStack_b0 = local_28;
  fStack_ac = local_28;
  local_158 = CONCAT44(local_28,local_28);
  uStack_150 = CONCAT44(local_28,local_28);
  local_2b8 = CONCAT44(local_28 * local_148._4_4_,local_28 * (float)local_148);
  uStack_2b0 = CONCAT44(local_28 * uStack_140._4_4_,local_28 * (float)uStack_140);
  local_38 = (float)local_438;
  local_c8 = local_38;
  fStack_c4 = local_38;
  fStack_c0 = local_38;
  fStack_bc = local_38;
  local_178 = CONCAT44(local_38,local_38);
  uStack_170 = CONCAT44(local_38,local_38);
  local_2c8 = CONCAT44(local_38 * local_148._4_4_,local_38 * (float)local_148);
  _fStack_2c0 = CONCAT44(local_38 * uStack_140._4_4_,local_38 * (float)uStack_140);
  local_1b0 = local_408 + 2;
  local_268 = *local_1b0;
  uStack_260 = local_408[3];
  uStack_44 = (undefined4)((ulong)local_458 >> 0x20);
  local_d8 = uStack_44;
  uStack_d4 = uStack_44;
  uStack_d0 = uStack_44;
  uStack_cc = uStack_44;
  afVar2[1] = (float)uStack_44;
  afVar2[0] = (float)uStack_44;
  afVar2[2] = (float)(int)local_268;
  afVar2[3] = (float)(int)((ulong)local_268 >> 0x20);
  b[2] = (float)(int)in_XMM3_Qa;
  b[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b[0] = local_18 * (float)local_148;
  b[1] = local_18 * local_148._4_4_;
  c_00[2] = (float)(int)in_XMM5_Qa;
  c_00[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_00[0] = (float)(int)in_XMM4_Qa;
  c_00[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  local_248 = local_3a8;
  local_198 = local_3a8;
  local_168 = local_188;
  uStack_160 = uStack_180;
  local_148 = local_188;
  uStack_140 = uStack_180;
  afVar2 = glmm_fmadd(afVar2,b,c_00);
  local_2a8 = afVar2._0_8_;
  local_58 = local_288;
  uVar1 = local_58;
  uStack_50 = uStack_280;
  local_58._4_4_ = (undefined4)((ulong)local_288 >> 0x20);
  local_e8 = local_58._4_4_;
  uStack_e4 = local_58._4_4_;
  uStack_e0 = local_58._4_4_;
  uStack_dc = local_58._4_4_;
  a[1] = (float)local_58._4_4_;
  a[0] = (float)local_58._4_4_;
  a[2] = (float)(undefined4)local_268;
  a[3] = (float)local_268._4_4_;
  b_00[2] = (float)(int)in_XMM3_Qa;
  b_00[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_00[0] = (float)(undefined4)local_2b8;
  b_00[1] = (float)local_2b8._4_4_;
  c_01[2] = (float)(int)in_XMM5_Qa;
  c_01[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_01[0] = (float)(int)in_XMM4_Qa;
  c_01[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  local_58 = uVar1;
  afVar2 = glmm_fmadd(a,b_00,c_01);
  local_2b8 = afVar2._0_8_;
  local_68 = local_298;
  uVar1 = local_68;
  uStack_60 = uStack_290;
  local_68._4_4_ = (undefined4)((ulong)local_298 >> 0x20);
  local_f8 = local_68._4_4_;
  uStack_f4 = local_68._4_4_;
  uStack_f0 = local_68._4_4_;
  uStack_ec = local_68._4_4_;
  a_00[1] = (float)local_68._4_4_;
  a_00[0] = (float)local_68._4_4_;
  a_00[2] = (float)(undefined4)local_268;
  a_00[3] = (float)local_268._4_4_;
  b_01[2] = (float)(int)in_XMM3_Qa;
  b_01[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_01[0] = (float)(undefined4)local_2c8;
  b_01[1] = (float)local_2c8._4_4_;
  c_02[2] = (float)(int)in_XMM5_Qa;
  c_02[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_02[0] = (float)(int)in_XMM4_Qa;
  c_02[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  local_68 = uVar1;
  afVar2 = glmm_fmadd(a_00,b_01,c_02);
  local_2c8 = afVar2._0_8_;
  local_1b8 = local_240 + 4;
  local_268 = *local_1b8;
  uStack_260 = local_240[5];
  local_78 = local_278;
  uStack_70 = uStack_270;
  uVar1 = uStack_70;
  uStack_70._0_4_ = (undefined4)uStack_270;
  local_108 = (undefined4)uStack_70;
  uStack_104 = (undefined4)uStack_70;
  uStack_100 = (undefined4)uStack_70;
  uStack_fc = (undefined4)uStack_70;
  a_01[1] = (float)(undefined4)uStack_70;
  a_01[0] = (float)(undefined4)uStack_70;
  a_01[2] = (float)(int)local_268;
  a_01[3] = (float)(int)((ulong)local_268 >> 0x20);
  b_02[2] = (float)(int)in_XMM3_Qa;
  b_02[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_02[0] = (float)(undefined4)local_2a8;
  b_02[1] = (float)local_2a8._4_4_;
  c_03[2] = (float)(int)in_XMM5_Qa;
  c_03[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_03[0] = (float)(int)in_XMM4_Qa;
  c_03[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  uStack_70 = uVar1;
  afVar2 = glmm_fmadd(a_01,b_02,c_03);
  local_2a8 = afVar2._0_8_;
  local_88 = local_288;
  uStack_80 = uStack_280;
  uVar1 = uStack_80;
  uStack_80._0_4_ = (undefined4)uStack_280;
  local_118 = (undefined4)uStack_80;
  uStack_114 = (undefined4)uStack_80;
  uStack_110 = (undefined4)uStack_80;
  uStack_10c = (undefined4)uStack_80;
  a_02[1] = (float)(undefined4)uStack_80;
  a_02[0] = (float)(undefined4)uStack_80;
  a_02[2] = (float)(undefined4)local_268;
  a_02[3] = (float)local_268._4_4_;
  b_03[2] = (float)(int)in_XMM3_Qa;
  b_03[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_03[0] = (float)(undefined4)local_2b8;
  b_03[1] = (float)local_2b8._4_4_;
  c_04[2] = (float)(int)in_XMM5_Qa;
  c_04[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_04[0] = (float)(int)in_XMM4_Qa;
  c_04[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  uStack_2a0 = extraout_XMM0_Qb;
  uStack_80 = uVar1;
  afVar2 = glmm_fmadd(a_02,b_03,c_04);
  local_2b8 = afVar2._0_8_;
  local_98 = local_298;
  uStack_90 = uStack_290;
  uVar1 = uStack_90;
  uStack_90._0_4_ = (undefined4)uStack_290;
  local_128 = (undefined4)uStack_90;
  uStack_124 = (undefined4)uStack_90;
  uStack_120 = (undefined4)uStack_90;
  uStack_11c = (undefined4)uStack_90;
  a_03[1] = (float)(undefined4)uStack_90;
  a_03[0] = (float)(undefined4)uStack_90;
  a_03[2] = (float)(undefined4)local_268;
  a_03[3] = (float)local_268._4_4_;
  b_04[2] = (float)(int)in_XMM3_Qa;
  b_04[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_04[0] = (float)(undefined4)local_2c8;
  b_04[1] = (float)local_2c8._4_4_;
  c_05[2] = (float)(int)in_XMM5_Qa;
  c_05[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_05[0] = (float)(int)in_XMM4_Qa;
  c_05[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  uStack_2b0 = extraout_XMM0_Qb_00;
  uStack_90 = uVar1;
  afVar2 = glmm_fmadd(a_03,b_04,c_05);
  *local_250 = local_2a8;
  local_250[1] = uStack_2a0;
  local_250[2] = local_2b8;
  local_250[3] = uStack_2b0;
  local_250[4] = afVar2._0_8_;
  local_250[5] = extraout_XMM0_Qb_01;
  uVar1 = local_240[7];
  local_250[6] = local_240[6];
  local_250[7] = uVar1;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_rotate(mat4 m, float angle, vec3 axis) {
  glm_rotate(m, angle, axis);
}